

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixFile_Seek(void *pUserData,jx9_int64 iOfft,int whence)

{
  __off_t _Var1;
  off_t iNew;
  int whence_local;
  jx9_int64 iOfft_local;
  void *pUserData_local;
  
  if (whence != 0) {
    if (whence == 1) {
      iNew._4_4_ = 1;
      goto LAB_0016142e;
    }
    if (whence == 2) {
      iNew._4_4_ = 2;
      goto LAB_0016142e;
    }
  }
  iNew._4_4_ = 0;
LAB_0016142e:
  _Var1 = lseek((int)pUserData,iOfft,iNew._4_4_);
  if (_Var1 < 0) {
    pUserData_local._4_4_ = -1;
  }
  else {
    pUserData_local._4_4_ = 0;
  }
  return pUserData_local._4_4_;
}

Assistant:

static int UnixFile_Seek(void *pUserData, jx9_int64 iOfft, int whence)
{
	off_t iNew;
	switch(whence){
	case 1:/*SEEK_CUR*/
		whence = SEEK_CUR;
		break;
	case 2: /* SEEK_END */
		whence = SEEK_END;
		break;
	case 0: /* SEEK_SET */
	default:
		whence = SEEK_SET;
		break;
	}
	iNew = lseek(SX_PTR_TO_INT(pUserData), (off_t)iOfft, whence);
	if( iNew < 0 ){
		return -1;
	}
	return JX9_OK;
}